

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

int If_CutDelayRecCost3(If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pObj)

{
  int iVar1;
  char pCanonPerm [16];
  uint local_2c;
  char local_28 [24];
  
  if (s_pMan3->nVars != (uint)(byte)pCut->field_0x1e) {
    __assert_fail("p->nVars == (int)pCut->nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x3f2,"int If_CutDelayRecCost3(If_Man_t *, If_Cut_t *, If_Obj_t *)");
  }
  if (s_pMan3->fLibConstr == 0) {
    if (s_pMan3->vTruthPo == (Vec_Int_t *)0x0) {
      Lms_ManPrepare(s_pMan3);
    }
    iVar1 = If_CutFindBestStruct(pIfMan,pCut,local_28,&local_2c,(int *)0x0);
    return iVar1;
  }
  __assert_fail("!p->fLibConstr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x3f5,"int If_CutDelayRecCost3(If_Man_t *, If_Cut_t *, If_Obj_t *)");
}

Assistant:

int If_CutDelayRecCost3( If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    // make sure the cut functions match the library
    assert( p->nVars == (int)pCut->nLimit );
    // if this assertion fires, it means that LMS manager was used for library construction
    // in this case, GIA has to be written out and the manager restarted as described above
    assert( !p->fLibConstr );
    if ( p->vTruthPo == NULL )
        Lms_ManPrepare( p );
    // return the delay of the best structure
    return If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, NULL );
}